

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_diag(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  int64_t local_28;
  int64_t local_20;
  int64_t local_18;
  int64_t iStack_10;
  
  if (a->ne[1] == 1) {
    local_28 = a->ne[0];
    local_18 = a->ne[2];
    iStack_10 = a->ne[3];
    local_20 = local_28;
    pgVar1 = ggml_new_tensor(ctx,a->type,4,&local_28);
    pgVar1->op = GGML_OP_DIAG;
    pgVar1->src[0] = a;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd2b,
             "GGML_ASSERT(%s) failed","a->ne[1] == 1");
}

Assistant:

struct ggml_tensor * ggml_diag(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    GGML_ASSERT(a->ne[1] == 1);

    const int64_t ne[4] = { a->ne[0], a->ne[0], a->ne[2], a->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, 4, ne);

    result->op     = GGML_OP_DIAG;
    result->src[0] = a;

    return result;
}